

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
operator()(arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *this,
          handle handle)

{
  if (this->ptr_ != (char *)0x0) {
    advance_to<char,fmt::v7::detail::error_handler>(this->parse_ctx_,this->ptr_);
  }
  (*handle.custom_.format)(handle.custom_.value,this->parse_ctx_,this->ctx_);
  return (iterator)(this->ctx_->out_).container;
}

Assistant:

iterator operator()(typename basic_format_arg<context_type>::handle handle) {
    if (ptr_) advance_to(*parse_ctx_, ptr_);
    handle.format(*parse_ctx_, ctx_);
    return ctx_.out();
  }